

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_radix_tree_t * ngx_radix_tree_create(ngx_pool_t *pool,ngx_int_t preallocate)

{
  ngx_radix_tree_t *tree;
  ngx_radix_node_t *pnVar1;
  ngx_int_t nVar2;
  uint32_t key;
  uint uVar3;
  uint mask;
  
  tree = (ngx_radix_tree_t *)ngx_palloc(pool,0x28);
  if (tree != (ngx_radix_tree_t *)0x0) {
    tree->pool = pool;
    tree->free = (ngx_radix_node_t *)0x0;
    tree->start = (char *)0x0;
    tree->size = 0;
    pnVar1 = ngx_radix_alloc(tree);
    tree->root = pnVar1;
    if (pnVar1 != (ngx_radix_node_t *)0x0) {
      pnVar1->right = (ngx_radix_node_t *)0x0;
      pnVar1->left = (ngx_radix_node_t *)0x0;
      pnVar1->parent = (ngx_radix_node_t *)0x0;
      pnVar1->value = 0xffffffffffffffff;
      if (preallocate == 0) {
        return tree;
      }
      if (preallocate == -1) {
        preallocate = 6;
        if (ngx_pagesize >> 5 != 0x80) {
          preallocate = (ulong)(ngx_pagesize >> 5 != 0x100) + 7;
        }
      }
      uVar3 = 0x80000000;
      mask = 0;
      do {
        preallocate = preallocate + -1;
        mask = mask >> 1 | 0x80000000;
        key = 0;
        do {
          nVar2 = ngx_radix32tree_insert(tree,key,mask,0xffffffffffffffff);
          if (nVar2 != 0) {
            return (ngx_radix_tree_t *)0x0;
          }
          key = key + uVar3;
        } while (key != 0);
        uVar3 = uVar3 >> 1;
      } while (preallocate != 0);
      return tree;
    }
  }
  return (ngx_radix_tree_t *)0x0;
}

Assistant:

ngx_radix_tree_t *
ngx_radix_tree_create(ngx_pool_t *pool, ngx_int_t preallocate)
{
    uint32_t           key, mask, inc;
    ngx_radix_tree_t  *tree;

    tree = ngx_palloc(pool, sizeof(ngx_radix_tree_t));
    if (tree == NULL) {
        return NULL;
    }

    tree->pool = pool;
    tree->free = NULL;
    tree->start = NULL;
    tree->size = 0;

    tree->root = ngx_radix_alloc(tree);
    if (tree->root == NULL) {
        return NULL;
    }

    tree->root->right = NULL;
    tree->root->left = NULL;
    tree->root->parent = NULL;
    tree->root->value = NGX_RADIX_NO_VALUE;

    if (preallocate == 0) {
        return tree;
    }

    /*
     * Preallocation of first nodes : 0, 1, 00, 01, 10, 11, 000, 001, etc.
     * increases TLB hits even if for first lookup iterations.
     * On 32-bit platforms the 7 preallocated bits takes continuous 4K,
     * 8 - 8K, 9 - 16K, etc.  On 64-bit platforms the 6 preallocated bits
     * takes continuous 4K, 7 - 8K, 8 - 16K, etc.  There is no sense to
     * to preallocate more than one page, because further preallocation
     * distributes the only bit per page.  Instead, a random insertion
     * may distribute several bits per page.
     *
     * Thus, by default we preallocate maximum
     *     6 bits on amd64 (64-bit platform and 4K pages)
     *     7 bits on i386 (32-bit platform and 4K pages)
     *     7 bits on sparc64 in 64-bit mode (8K pages)
     *     8 bits on sparc64 in 32-bit mode (8K pages)
     */

    if (preallocate == -1) {
        switch (ngx_pagesize / sizeof(ngx_radix_node_t)) {

        /* amd64 */
        case 128:
            preallocate = 6;
            break;

        /* i386, sparc64 */
        case 256:
            preallocate = 7;
            break;

        /* sparc64 in 32-bit mode */
        default:
            preallocate = 8;
        }
    }

    mask = 0;
    inc = 0x80000000;

    while (preallocate--) {

        key = 0;
        mask >>= 1;
        mask |= 0x80000000;

        do {
            if (ngx_radix32tree_insert(tree, key, mask, NGX_RADIX_NO_VALUE)
                != NGX_OK)
            {
                return NULL;
            }

            key += inc;

        } while (key);

        inc >>= 1;
    }

    return tree;
}